

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testValidBranch(void)

{
  pointer pcVar1;
  int iVar2;
  ConvolutionLayerParams *pCVar3;
  long lVar4;
  bool bVar5;
  ModelDescription *pMVar6;
  Type *pTVar7;
  FeatureType *pFVar8;
  ArrayFeatureType *pAVar9;
  Type *pTVar10;
  ActivationParams *pAVar11;
  ActivationReLU *pAVar12;
  TypeUnion this;
  BranchLayerParams *this_00;
  NeuralNetwork *pNVar13;
  ostream *poVar14;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_01;
  Result res;
  Model m;
  NeuralNetwork nnIf;
  NeuralNetwork nnElse;
  undefined1 local_130 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  Model local_108;
  undefined1 local_d8 [16];
  RepeatedPtrFieldBase local_c8 [3];
  undefined1 local_80 [16];
  RepeatedPtrFieldBase local_70 [3];
  
  CoreML::Specification::Model::Model(&local_108);
  if (local_108.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_108.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_108.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_d8._0_8_ = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"A","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_d8);
  if ((RepeatedPtrFieldBase *)local_d8._0_8_ != local_c8) {
    operator_delete((void *)local_d8._0_8_,(ulong)((long)local_c8[0].arena_ + 1));
  }
  if (pTVar7->type_ == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  if (pTVar7->type_ == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9 = (pFVar8->Type_).multiarraytype_;
  iVar2 = (pAVar9->shape_).total_size_;
  if ((pAVar9->shape_).current_size_ == iVar2) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar9->shape_,iVar2 + 1);
  }
  iVar2 = (pAVar9->shape_).current_size_;
  (pAVar9->shape_).current_size_ = iVar2 + 1;
  ((pAVar9->shape_).rep_)->elements[iVar2] = 1;
  if (local_108.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_108.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_108.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_d8._0_8_ = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"B","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_d8);
  if ((RepeatedPtrFieldBase *)local_d8._0_8_ != local_c8) {
    operator_delete((void *)local_d8._0_8_,(ulong)((long)local_c8[0].arena_ + 1));
  }
  if (pTVar7->type_ == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  CoreML::Specification::NeuralNetwork::NeuralNetwork((NeuralNetwork *)local_d8);
  pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      (local_c8,(Type *)0x0);
  if (pTVar10->_oneof_case_[0] != 0x82) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar10);
    pTVar10->_oneof_case_[0] = 0x82;
    pAVar11 = (ActivationParams *)operator_new(0x20);
    CoreML::Specification::ActivationParams::ActivationParams(pAVar11);
    (pTVar10->layer_).activation_ = pAVar11;
  }
  pAVar11 = (pTVar10->layer_).activation_;
  if (pAVar11->_oneof_case_[0] != 10) {
    CoreML::Specification::ActivationParams::clear_NonlinearityType(pAVar11);
    pAVar11->_oneof_case_[0] = 10;
    pAVar12 = (ActivationReLU *)operator_new(0x18);
    CoreML::Specification::ActivationReLU::ActivationReLU(pAVar12);
    (pAVar11->NonlinearityType_).relu_ = pAVar12;
  }
  local_80._0_8_ = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"if_relu","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar10->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((RepeatedPtrFieldBase *)local_80._0_8_ != local_70) {
    operator_delete((void *)local_80._0_8_,(ulong)((long)local_70[0].arena_ + 1));
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar10,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar10,"B");
  CoreML::Specification::NeuralNetwork::NeuralNetwork((NeuralNetwork *)local_80);
  pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      (local_70,(Type *)0x0);
  if (pTVar10->_oneof_case_[0] != 0x82) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar10);
    pTVar10->_oneof_case_[0] = 0x82;
    pAVar11 = (ActivationParams *)operator_new(0x20);
    CoreML::Specification::ActivationParams::ActivationParams(pAVar11);
    (pTVar10->layer_).activation_ = pAVar11;
  }
  pAVar11 = (pTVar10->layer_).activation_;
  if (pAVar11->_oneof_case_[0] != 10) {
    CoreML::Specification::ActivationParams::clear_NonlinearityType(pAVar11);
    pAVar11->_oneof_case_[0] = 10;
    pAVar12 = (ActivationReLU *)operator_new(0x18);
    CoreML::Specification::ActivationReLU::ActivationReLU(pAVar12);
    (pAVar11->NonlinearityType_).relu_ = pAVar12;
  }
  pcVar1 = local_130 + 0x10;
  local_130._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"else_relu","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar10->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_130);
  if ((pointer)local_130._0_8_ != pcVar1) {
    operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar10,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar10,"B");
  if (local_108._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_108);
    local_108._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_108.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  (local_108.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_01 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_108.Type_.pipeline_)->models_;
  pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)this_01,(Type *)0x0);
  if (pTVar10->_oneof_case_[0] != 0x82) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar10);
    pTVar10->_oneof_case_[0] = 0x82;
    pAVar11 = (ActivationParams *)operator_new(0x20);
    CoreML::Specification::ActivationParams::ActivationParams(pAVar11);
    (pTVar10->layer_).activation_ = pAVar11;
  }
  pAVar11 = (pTVar10->layer_).activation_;
  if (pAVar11->_oneof_case_[0] != 10) {
    CoreML::Specification::ActivationParams::clear_NonlinearityType(pAVar11);
    pAVar11->_oneof_case_[0] = 10;
    pAVar12 = (ActivationReLU *)operator_new(0x18);
    CoreML::Specification::ActivationReLU::ActivationReLU(pAVar12);
    (pAVar11->NonlinearityType_).relu_ = pAVar12;
  }
  local_130._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_130,"condition_producing_layer","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar10->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_130);
  if ((pointer)local_130._0_8_ != pcVar1) {
    operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar10,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar10,"cond");
  pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)this_01,(Type *)0x0);
  if (pTVar10->_oneof_case_[0] != 0x25d) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar10);
    pTVar10->_oneof_case_[0] = 0x25d;
    this_00 = (BranchLayerParams *)operator_new(0x28);
    CoreML::Specification::BranchLayerParams::BranchLayerParams(this_00);
    (pTVar10->layer_).branch_ = this_00;
  }
  pCVar3 = (pTVar10->layer_).convolution_;
  local_130._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"branch_layer","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar10->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_130);
  if ((pointer)local_130._0_8_ != pcVar1) {
    operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar10,"cond");
  lVar4._0_4_ = (pCVar3->kernelsize_).current_size_;
  lVar4._4_4_ = (pCVar3->kernelsize_).total_size_;
  if (lVar4 == 0) {
    pNVar13 = (NeuralNetwork *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(pNVar13);
    *(NeuralNetwork **)&pCVar3->kernelsize_ = pNVar13;
  }
  CoreML::Specification::NeuralNetwork::CopyFrom
            (*(NeuralNetwork **)&pCVar3->kernelsize_,(NeuralNetwork *)local_d8);
  if ((pCVar3->kernelsize_).rep_ == (Rep *)0x0) {
    pNVar13 = (NeuralNetwork *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(pNVar13);
    (pCVar3->kernelsize_).rep_ = (Rep *)pNVar13;
  }
  CoreML::Specification::NeuralNetwork::CopyFrom
            ((NeuralNetwork *)(pCVar3->kernelsize_).rep_,(NeuralNetwork *)local_80);
  CoreML::validate<(MLModelType)500>((Result *)local_130,&local_108);
  bVar5 = CoreML::Result::good((Result *)local_130);
  if (!bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x10e6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._8_8_ != &local_118) {
    operator_delete((void *)local_130._8_8_,local_118._0_8_ + 1);
  }
  CoreML::Specification::NeuralNetwork::~NeuralNetwork((NeuralNetwork *)local_80);
  CoreML::Specification::NeuralNetwork::~NeuralNetwork((NeuralNetwork *)local_d8);
  CoreML::Specification::Model::~Model(&local_108);
  return (uint)!bVar5;
}

Assistant:

int testValidBranch() {
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    
    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();
    
    // "If" net
    Specification::NeuralNetwork nnIf;
    auto *l1 = nnIf.add_layers();
    (void)l1->mutable_activation()->mutable_relu();
    l1->set_name("if_relu");
    l1->add_input("A");
    l1->add_output("B");
    
    // "else" net
    Specification::NeuralNetwork nnElse;
    auto *l2 = nnElse.add_layers();
    (void)l2->mutable_activation()->mutable_relu();
    l2->set_name("else_relu");
    l2->add_input("A");
    l2->add_output("B");
    
    // Main network
    auto *nnMain = m.mutable_neuralnetwork();
    nnMain->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    auto *l3 = nnMain->add_layers();
    (void)l3->mutable_activation()->mutable_relu();
    l3->set_name("condition_producing_layer");
    l3->add_input("A");
    l3->add_output("cond");
    
    auto *l4 = nnMain->add_layers();
    auto *branch_layer = l4->mutable_branch();
    l4->set_name("branch_layer");
    l4->add_input("cond");
    branch_layer->mutable_ifbranch()->CopyFrom(nnIf);
    branch_layer->mutable_elsebranch()->CopyFrom(nnElse);
    
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_GOOD(res);
    return 0;
}